

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_start_seqimap(Parser *this)

{
  Tree *pTVar1;
  char *pcVar2;
  char *pcVar3;
  code *pcVar4;
  csubstr s;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  NodeType_e NVar8;
  bool bVar9;
  size_t sVar10;
  NodeScalar *pNVar11;
  char msg [35];
  char *local_c8;
  size_t sStack_c0;
  char local_b8 [48];
  char *local_88;
  size_t sStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if ((~this->m_state->flags & 0x18U) != 0) {
    builtin_strncpy(local_b8,"as_all(RSEQ|FLOW))",0x13);
    local_c8 = (char *)0x6166206b63656863;
    sStack_c0._0_1_ = 'i';
    sStack_c0._1_1_ = 'l';
    sStack_c0._2_1_ = 'e';
    sStack_c0._3_1_ = 'd';
    sStack_c0._4_1_ = ':';
    sStack_c0._5_1_ = ' ';
    sStack_c0._6_1_ = '(';
    sStack_c0._7_1_ = 'h';
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_58 = 0;
    uStack_50 = 0x78cc;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x78cc) << 0x40);
    LVar5.name.str._0_4_ = 0x1ff89a;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_c8,0x23,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  bVar9 = Tree::has_children(this->m_tree,this->m_state->node_id);
  if (bVar9) {
    pTVar1 = this->m_tree;
    sVar10 = Tree::last_child(pTVar1,this->m_state->node_id);
    if ((sVar10 == 0xffffffffffffffff) || (pTVar1->m_cap <= sVar10)) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_c8 = (char *)0x0;
      sStack_c0._0_1_ = -0x7a;
      sStack_c0._1_1_ = 'K';
      sStack_c0._2_1_ = '\0';
      sStack_c0._3_1_ = '\0';
      sStack_c0._4_1_ = '\0';
      sStack_c0._5_1_ = '\0';
      sStack_c0._6_1_ = '\0';
      sStack_c0._7_1_ = '\0';
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = -0x66;
      local_b8[9] = -8;
      local_b8[10] = '\x1f';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = 'e';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      (*(code *)PTR_error_impl_00242518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[sVar10].m_type.type & VAL) != NOTYPE) {
      sVar10 = Tree::last_child(this->m_tree,this->m_state->node_id);
      pTVar1 = this->m_tree;
      if ((sVar10 == 0xffffffffffffffff) || (pTVar1->m_cap <= sVar10)) {
        if ((s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_c8 = (char *)0x0;
        sStack_c0._0_1_ = -0x7d;
        sStack_c0._1_1_ = 'K';
        sStack_c0._2_1_ = '\0';
        sStack_c0._3_1_ = '\0';
        sStack_c0._4_1_ = '\0';
        sStack_c0._5_1_ = '\0';
        sStack_c0._6_1_ = '\0';
        sStack_c0._7_1_ = '\0';
        local_b8[0] = '\0';
        local_b8[1] = '\0';
        local_b8[2] = '\0';
        local_b8[3] = '\0';
        local_b8[4] = '\0';
        local_b8[5] = '\0';
        local_b8[6] = '\0';
        local_b8[7] = '\0';
        local_b8[8] = -0x66;
        local_b8[9] = -8;
        local_b8[10] = '\x1f';
        local_b8[0xb] = '\0';
        local_b8[0xc] = '\0';
        local_b8[0xd] = '\0';
        local_b8[0xe] = '\0';
        local_b8[0xf] = '\0';
        local_b8[0x10] = 'e';
        local_b8[0x11] = '\0';
        local_b8[0x12] = '\0';
        local_b8[0x13] = '\0';
        local_b8[0x14] = '\0';
        local_b8[0x15] = '\0';
        local_b8[0x16] = '\0';
        local_b8[0x17] = '\0';
        (*(code *)PTR_error_impl_00242518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      NVar8 = pTVar1->m_buf[sVar10].m_type.type;
      pNVar11 = Tree::valsc(this->m_tree,sVar10);
      local_c8 = (pNVar11->tag).str;
      sStack_c0 = (pNVar11->tag).len;
      s = pNVar11->scalar;
      local_88 = (pNVar11->anchor).str;
      sStack_80 = (pNVar11->anchor).len;
      pTVar1 = this->m_tree;
      Tree::remove_children(pTVar1,sVar10);
      Tree::_release(pTVar1,sVar10);
      _push_level(this,false);
      _start_map(this,true);
      _store_scalar(this,s,(uint)((~(int)NVar8 & 0x1001U) == 0));
      (this->m_key_anchor).str = local_88;
      (this->m_key_anchor).len = sStack_80;
      (this->m_key_tag).str = local_c8;
      (this->m_key_tag).len = sStack_c0;
      goto LAB_001dc982;
    }
  }
  _push_level(this,false);
  _start_map(this,true);
  pcVar2 = (this->m_state->line_contents).rem.str;
  pcVar3 = (this->m_buf).str;
  if ((pcVar2 < pcVar3) || (pcVar3 + (this->m_buf).len < pcVar2)) {
    builtin_strncpy(local_b8 + 0x20,"buf.end())",0xb);
    builtin_strncpy(local_b8 + 0x10,"n() && str <= m_",0x10);
    builtin_strncpy(local_b8,"tr >= m_buf.begi",0x10);
    local_c8 = (char *)0x6166206b63656863;
    sStack_c0._0_1_ = 'i';
    sStack_c0._1_1_ = 'l';
    sStack_c0._2_1_ = 'e';
    sStack_c0._3_1_ = 'd';
    sStack_c0._4_1_ = ':';
    sStack_c0._5_1_ = ' ';
    sStack_c0._6_1_ = '(';
    sStack_c0._7_1_ = 's';
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_88 = (char *)0x0;
    sStack_80 = 0x5e97;
    local_78 = 0;
    pcStack_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x5e97) << 0x40);
    LVar7.name.str._0_4_ = 0x1ff89a;
    LVar7.super_LineCol.offset = auVar6._0_8_;
    LVar7.super_LineCol.line = auVar6._8_8_;
    LVar7.super_LineCol.col = auVar6._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_c8,0x3b,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  _store_scalar(this,(csubstr)ZEXT816(0),0);
LAB_001dc982:
  this->m_state->flags = this->m_state->flags | 0x2010;
  return;
}

Assistant:

void Parser::_start_seqimap()
{
    _c4dbgpf("start_seqimap at node={}. has_children={}", m_state->node_id, m_tree->has_children(m_state->node_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));
    // create a map, and turn the last scalar of this sequence
    // into the key of the map's first child. This scalar was
    // understood to be a value in the sequence, but it is
    // actually a key of a map, implicitly opened here.
    // Eg [val, key: val]
    //
    // Yep, YAML is crazy.
    if(m_tree->has_children(m_state->node_id) && m_tree->has_val(m_tree->last_child(m_state->node_id)))
    {
        size_t prev = m_tree->last_child(m_state->node_id);
        NodeType ty = m_tree->_p(prev)->m_type; // don't use type() because it masks out the quotes
        NodeScalar tmp = m_tree->valsc(prev);
        _c4dbgpf("has children and last child={} has val. saving the scalars, val='{}' quoted={}", prev, tmp.scalar, ty.is_val_quoted());
        m_tree->remove(prev);
        _push_level();
        _start_map();
        _store_scalar(tmp.scalar, ty.is_val_quoted());
        m_key_anchor = tmp.anchor;
        m_key_tag = tmp.tag;
    }
    else
    {
        _c4dbgpf("node {} has no children yet, using empty key", m_state->node_id);
        _push_level();
        _start_map();
        _store_scalar_null(m_state->line_contents.rem.str);
    }
    add_flags(RSEQIMAP|FLOW);
}